

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Section::Section(Section *this,SectionInfo *info)

{
  int iVar1;
  IResultCapture *pIVar2;
  uint64_t uVar3;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_001c11b0;
  SectionInfo::SectionInfo(&this->m_info,info);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_assertions).passed = 0;
  (this->m_assertions).failed = 0;
  (this->m_assertions).failedButOk = 0;
  pIVar2 = getResultCapture();
  iVar1 = (*pIVar2->_vptr_IResultCapture[3])(pIVar2,&this->m_info,&this->m_assertions);
  this->m_sectionIncluded = SUB41(iVar1,0);
  (this->m_timer).m_ticks = 0;
  uVar3 = anon_unknown_22::getCurrentTicks();
  (this->m_timer).m_ticks = uVar3;
  return;
}

Assistant:

Section::Section( SectionInfo const& info )
    :   m_info( info ),
        m_sectionIncluded( getResultCapture().sectionStarted( m_info, m_assertions ) )
    {
        m_timer.start();
    }